

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonutils.cpp
# Opt level: O2

ModelPtr owningModel(ParentedEntityConstPtr *entity)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar1;
  ComponentPtr component;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  libcellml::ParentedEntity::parent();
  std::dynamic_pointer_cast<libcellml::Model,libcellml::ParentedEntity>
            ((shared_ptr<libcellml::ParentedEntity> *)entity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  owningComponent((ParentedEntityConstPtr *)&local_60);
  while (((entity->super___shared_ptr<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == (element_type *)0x0 && (local_60._M_ptr != (element_type *)0x0))) {
    libcellml::ParentedEntity::parent();
    std::dynamic_pointer_cast<libcellml::Model,libcellml::ParentedEntity>
              ((shared_ptr<libcellml::ParentedEntity> *)&local_40);
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)entity,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>(local_50,&local_60);
    owningComponent((ParentedEntityConstPtr *)&local_40);
    std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_60,(__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)&local_40
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entity;
  return (ModelPtr)MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr owningModel(const libcellml::ParentedEntityConstPtr &entity)
{
    auto model = std::dynamic_pointer_cast<libcellml::Model>(entity->parent());
    auto component = owningComponent(entity);
    while ((model == nullptr) && (component != nullptr)) {
        model = std::dynamic_pointer_cast<libcellml::Model>(component->parent());
        component = owningComponent(component);
    }

    return model;
}